

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O1

void __thiscall amrex::VisMF::clear(VisMF *this,int fabIndex,int compIndex)

{
  long *plVar1;
  
  plVar1 = *(long **)(*(long *)&(this->m_pa).
                                super_vector<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
                                .
                                super__Vector_base<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[compIndex].
                                super_vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                                .
                                super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                     + (long)fabIndex * 8);
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))();
  }
  *(undefined8 *)
   (*(long *)&(this->m_pa).
              super_vector<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
              .
              super__Vector_base<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[compIndex].
              super_vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
              super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_> +
   (long)fabIndex * 8) = 0;
  return;
}

Assistant:

void
VisMF::clear (int fabIndex,
              int compIndex)
{
    delete m_pa[compIndex][fabIndex];
    m_pa[compIndex][fabIndex] = 0;
}